

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

uint __thiscall
FuncInfo::FindOrAddRootObjectInlineCacheId
          (FuncInfo *this,PropertyId propertyId,bool isLoadMethod,bool isStore)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_48;
  uint local_44;
  RootObjectInlineCacheIdMap *local_40;
  RootObjectInlineCacheIdMap *local_38;
  RootObjectInlineCacheIdMap *idMap;
  byte local_16;
  byte local_15;
  uint cacheId;
  bool isStore_local;
  bool isLoadMethod_local;
  FuncInfo *pFStack_10;
  PropertyId propertyId_local;
  FuncInfo *this_local;
  
  local_16 = isStore;
  local_15 = isLoadMethod;
  cacheId = propertyId;
  pFStack_10 = this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xd9,"(propertyId != Js::Constants::NoProperty)",
                       "propertyId != Js::Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((local_15 & 1) != 0) && ((local_16 & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xda,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((local_16 & 1) == 0) {
    if ((local_15 & 1) == 0) {
      local_40 = this->rootObjectLoadInlineCacheMap;
    }
    else {
      local_40 = this->rootObjectLoadMethodInlineCacheMap;
    }
    local_38 = local_40;
  }
  else {
    local_38 = this->rootObjectStoreInlineCacheMap;
  }
  bVar2 = JsUtil::
          BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>(local_38,(int *)&cacheId,(uint *)((long)&idMap + 4));
  if (!bVar2) {
    if ((local_16 & 1) == 0) {
      if ((local_15 & 1) == 0) {
        local_48 = NewRootObjectLoadInlineCache(this);
      }
      else {
        local_48 = NewRootObjectLoadMethodInlineCache(this);
      }
      local_44 = local_48;
    }
    else {
      local_44 = NewRootObjectStoreInlineCache(this);
    }
    idMap._4_4_ = local_44;
    JsUtil::
    BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(local_38,(int *)&cacheId,(uint *)((long)&idMap + 4));
  }
  return idMap._4_4_;
}

Assistant:

uint FuncInfo::FindOrAddRootObjectInlineCacheId(Js::PropertyId propertyId, bool isLoadMethod, bool isStore)
{
    Assert(propertyId != Js::Constants::NoProperty);
    Assert(!isLoadMethod || !isStore);
    uint cacheId;
    RootObjectInlineCacheIdMap * idMap = isStore ? rootObjectStoreInlineCacheMap : isLoadMethod ? rootObjectLoadMethodInlineCacheMap : rootObjectLoadInlineCacheMap;
    if (!idMap->TryGetValue(propertyId, &cacheId))
    {
        cacheId = isStore ? this->NewRootObjectStoreInlineCache() : isLoadMethod ? this->NewRootObjectLoadMethodInlineCache() : this->NewRootObjectLoadInlineCache();
        idMap->Add(propertyId, cacheId);
    }
    return cacheId;
}